

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l1_fs.c
# Opt level: O0

int picnic_l1_fs_write_public_key(picnic_l1_fs_publickey_t *key,uint8_t *buf,size_t buflen)

{
  size_t buflen_local;
  uint8_t *buf_local;
  picnic_l1_fs_publickey_t *key_local;
  int local_4;
  
  if ((key == (picnic_l1_fs_publickey_t *)0x0) || (buf == (uint8_t *)0x0)) {
    local_4 = -1;
  }
  else if (buflen < 0x21) {
    local_4 = -1;
  }
  else {
    *buf = '\x01';
    *(undefined8 *)(buf + 1) = *(undefined8 *)key->data;
    *(undefined8 *)(buf + 9) = *(undefined8 *)(key->data + 8);
    *(undefined8 *)(buf + 0x11) = *(undefined8 *)(key->data + 0x10);
    *(undefined8 *)(buf + 0x19) = *(undefined8 *)(key->data + 0x18);
    local_4 = 0x21;
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l1_fs_write_public_key(const picnic_l1_fs_publickey_t* key,
                                                            uint8_t* buf, size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  if (buflen < PUBLIC_KEY_SIZE) {
    return -1;
  }

  buf[0] = PARAM;
  memcpy(buf + 1, key->data, PUBLIC_KEY_SIZE - 1);
  return PUBLIC_KEY_SIZE;
}